

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateDependencyIncludes
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  string *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  undefined4 local_8c;
  undefined1 local_88 [8];
  string basename;
  int local_54;
  undefined1 local_50 [4];
  int i;
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  for (local_54 = 0; iVar2 = FileDescriptor::dependency_count(this->file_), local_54 < iVar2;
      local_54 = local_54 + 1) {
    pFVar3 = FileDescriptor::dependency(this->file_,local_54);
    filename = FileDescriptor::name_abi_cxx11_(pFVar3);
    StripProto((string *)local_88,filename);
    pFVar3 = FileDescriptor::dependency(this->file_,local_54);
    bVar1 = IsDepWeak(this,pFVar3);
    if (bVar1) {
      local_8c = 4;
    }
    else {
      bVar1 = IsBootstrapProto(&this->options_,this->file_);
      if (bVar1) {
        GetBootstrapBasename(&this->options_,(string *)local_88,(string *)local_88);
      }
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     ".pb.h");
      pFVar3 = FileDescriptor::dependency(this->file_,local_54);
      CreateHeaderInclude(&local_b0,this,&local_d0,pFVar3);
      Formatter::operator()((Formatter *)local_50,"#include $1$\n",&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_8c = 0;
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateDependencyIncludes(io::Printer* printer) {
  Formatter format(printer, variables_);
  for (int i = 0; i < file_->dependency_count(); i++) {
    std::string basename = StripProto(file_->dependency(i)->name());

    // Do not import weak deps.
    if (IsDepWeak(file_->dependency(i))) continue;

    if (IsBootstrapProto(options_, file_)) {
      GetBootstrapBasename(options_, basename, &basename);
    }

    format("#include $1$\n",
           CreateHeaderInclude(basename + ".pb.h", file_->dependency(i)));
  }
}